

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_CArena.cpp
# Opt level: O3

void __thiscall amrex::CArena::PrintUsage(CArena *this,ostream *os,string *name,string *space)

{
  ostream *poVar1;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(space->_M_dataplus)._M_p,space->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"[",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] space allocated (MB): ",0x18);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(space->_M_dataplus)._M_p,space->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"[",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] space used      (MB): ",0x18);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(space->_M_dataplus)._M_p,space->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"[",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]: ",3);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," allocs, ",9);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," busy blocks, ",0xe);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," free blocks\n",0xd);
  return;
}

Assistant:

void
CArena::PrintUsage (std::ostream& os, std::string const& name, std::string const& space) const
{
    Long megabytes = heap_space_used() / (1024*1024);
    Long actual_megabytes = heap_space_actually_used() / (1024*1024);
    os << space << "[" << name << "] space allocated (MB): " << megabytes << "\n";
    os << space << "[" << name << "] space used      (MB): " << actual_megabytes << "\n";
    os << space << "[" << name << "]: " << m_alloc.size() << " allocs, "
       << m_busylist.size() << " busy blocks, " << m_freelist.size() << " free blocks\n";
}